

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::TessControlExecutor::
generateTessControlShader_abi_cxx11_
          (string *__return_storage_ptr__,TessControlExecutor *this,ShaderSpec *shaderSpec)

{
  ulong uVar1;
  ostream *poVar2;
  int local_1a4;
  int local_1a0;
  int ndx_1;
  int ndx;
  ostringstream local_190 [8];
  ostringstream src;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,
                  "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_190,(string *)(this + 0x30));
    std::operator<<(poVar2,"\n");
  }
  std::operator<<((ostream *)local_190,"\nlayout(vertices = 1) out;\n\n");
  shaderexecutor::anon_unknown_0::BufferIoExecutor::declareBufferBlocks
            ((ostream *)local_190,(ShaderSpec *)this);
  std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  for (local_1a0 = 0; local_1a0 < 2; local_1a0 = local_1a0 + 1) {
    poVar2 = std::operator<<((ostream *)local_190,"\tgl_TessLevelInner[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1a0);
    std::operator<<(poVar2,"] = 1.0;\n");
  }
  for (local_1a4 = 0; local_1a4 < 4; local_1a4 = local_1a4 + 1) {
    poVar2 = std::operator<<((ostream *)local_190,"\tgl_TessLevelOuter[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1a4);
    std::operator<<(poVar2,"] = 1.0;\n");
  }
  poVar2 = std::operator<<((ostream *)local_190,"\n");
  std::operator<<(poVar2,"\thighp uint invocationId = uint(gl_PrimitiveID);\n");
  shaderexecutor::anon_unknown_0::BufferIoExecutor::generateExecBufferIo
            ((ostream *)local_190,(ShaderSpec *)this,"invocationId");
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TessControlExecutor::generateTessControlShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;
	src <<  "#version 310 es\n"
			"#extension GL_EXT_tessellation_shader : require\n\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\nlayout(vertices = 1) out;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src << "}\n";

	return src.str();
}